

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O0

ref<immutable::transient_rrb<char,_false,_6>_> __thiscall
immutable::rrb_to_transient<char,false,6>(immutable *this,ref<immutable::rrb<char,_false,_6>_> *in)

{
  guid_type gVar1;
  transient_rrb<char,_false,_6> *ptVar2;
  rrb<char,_false,_6> *prVar3;
  leaf_node<char,_false> *plVar4;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_38 [3];
  undefined1 local_19;
  ref<immutable::rrb<char,_false,_6>_> *local_18;
  ref<immutable::rrb<char,_false,_6>_> *in_local;
  ref<immutable::transient_rrb<char,_false,_6>_> *trrb;
  
  local_19 = 0;
  local_18 = in;
  in_local = (ref<immutable::rrb<char,_false,_6>_> *)this;
  ptVar2 = rrb_details::transient_rrb_head_create<char,false,6>(in->ptr);
  ref<immutable::transient_rrb<char,_false,_6>_>::ref
            ((ref<immutable::transient_rrb<char,_false,_6>_> *)this,ptVar2);
  gVar1 = rrb_details::rrb_guid_create();
  ptVar2 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->
                     ((ref<immutable::transient_rrb<char,_false,_6>_> *)this);
  ptVar2->guid = gVar1;
  prVar3 = ref<immutable::rrb<char,_false,_6>_>::operator->(local_18);
  plVar4 = (prVar3->tail).ptr;
  ptVar2 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->
                     ((ref<immutable::transient_rrb<char,_false,_6>_> *)this);
  plVar4 = rrb_details::transient_leaf_node_clone<char,false,6>(plVar4,ptVar2->guid);
  ref<immutable::rrb_details::leaf_node<char,_false>_>::ref(local_38,plVar4);
  ptVar2 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->
                     ((ref<immutable::transient_rrb<char,_false,_6>_> *)this);
  ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=(&ptVar2->tail,local_38);
  ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref(local_38);
  return (ref<immutable::transient_rrb<char,_false,_6>_>)(transient_rrb<char,_false,_6> *)this;
}

Assistant:

inline ref<transient_rrb<T, atomic_ref_counting, N>> rrb_to_transient(const ref<rrb<T, atomic_ref_counting, N>>& in)
    {
    using namespace rrb_details;
    ref<transient_rrb<T, atomic_ref_counting, N>> trrb = transient_rrb_head_create(in.ptr);
    trrb->guid = rrb_guid_create();
    trrb->tail = transient_leaf_node_clone<T, atomic_ref_counting, N>(in->tail.ptr, trrb->guid);
    return trrb;
    }